

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::UnpackedUnionType::getDefaultValueImpl(UnpackedUnionType *this)

{
  bool bVar1;
  Type *pTVar2;
  ConstantValue *in_RSI;
  Type *in_RDI;
  SVUnion u;
  nullptr_t in_stack_ffffffffffffff68;
  Type *this_00;
  
  this_00 = in_RDI;
  bVar1 = std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::empty
                    ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)0x4d486d)
  ;
  if (bVar1) {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffff68);
  }
  else {
    SVUnion::SVUnion((SVUnion *)in_RDI);
    std::span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::FieldSymbol_*const,_18446744073709551615UL> *)
               ((_Storage<unsigned_int,_true> *)
                &in_RSI[3].value.
                 super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 .
                 super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + 2),0);
    pTVar2 = ValueSymbol::getType((ValueSymbol *)0x4d48aa);
    Type::getDefaultValue(this_00);
    slang::ConstantValue::operator=((ConstantValue *)in_RDI,(ConstantValue *)pTVar2);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x4d48d9);
    if ((*(bool *)((_Storage<unsigned_int,_true> *)
                   &in_RSI[4].value.
                    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    .
                    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  + 1) & 1U) == 0) {
      std::optional<unsigned_int>::operator=((optional<unsigned_int> *)in_RSI,(int *)this_00);
    }
    slang::ConstantValue::ConstantValue(in_RSI,(SVUnion *)this_00);
    SVUnion::~SVUnion((SVUnion *)0x4d4939);
  }
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue UnpackedUnionType::getDefaultValueImpl() const {
    if (fields.empty())
        return nullptr;

    SVUnion u;
    u.value = fields[0]->getType().getDefaultValue();

    // Tagged unions start out with no active member.
    if (!isTagged)
        u.activeMember = 0;

    return u;
}